

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  uint uVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIRFunction *this_00;
  size_type sVar7;
  SPIRType *pSVar8;
  CompilerError *this_01;
  SPIRExtension *pSVar9;
  mapped_type *pmVar10;
  reference puVar11;
  size_t sVar12;
  SPIRVariable *pSVar13;
  Decoration *pDVar14;
  mapped_type *pmVar15;
  mapped_type *this_02;
  char *pcVar16;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar17;
  TypedID *local_590;
  byte *local_588;
  TypedID *local_578;
  byte *local_570;
  string *local_558;
  bool local_54f;
  bool local_54e;
  bool local_54d;
  bool local_54c;
  bool local_54b;
  bool local_54a;
  bool local_549;
  byte local_511;
  TypedID<(spirv_cross::Types)0> local_4e8;
  TypedID<(spirv_cross::Types)0> local_4e4;
  int local_4e0 [2];
  ID local_4d8;
  TypeID local_4d4;
  uint32_t local_4d0;
  TypedID<(spirv_cross::Types)0> local_4cc;
  uint32_t next_id_1;
  StorageClass local_4c4;
  ID local_4c0;
  TypeID local_4bc;
  SPIRType *local_4b8;
  SPIRType *ptr_1;
  uint32_t var_id;
  uint32_t ptr_type_id;
  uint32_t next_ids;
  BuiltIn builtin;
  TypedID<(spirv_cross::Types)1> *mbr_type_id;
  TypedID<(spirv_cross::Types)1> *__end5;
  TypedID<(spirv_cross::Types)1> *__begin5;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range5;
  uint32_t local_478;
  uint32_t mbr_idx_1;
  ID local_470;
  int local_46c [2];
  ID local_464;
  TypeID local_460;
  uint32_t local_45c;
  byte *pbStack_458;
  uint32_t next_id;
  bool *added_out;
  byte *local_448;
  bool *added_in;
  uint local_438;
  uint32_t local_434;
  uint32_t mbr_idx;
  string name;
  bool is_redirected_to_global_stage_io;
  bool variable_is_stage_io;
  bool is_builtin;
  bool is_patch_block_storage;
  bool is_control_point_storage;
  ID local_400;
  bool is_block;
  ID local_3f8;
  uint32_t uStack_3f4;
  bool is_patch;
  SPIRType *pSStack_3f0;
  BuiltIn bi_type;
  SPIRType *p_type;
  SPIRVariable *pSStack_3e0;
  uint32_t type_id;
  SPIRVariable *var_1;
  iterator iStack_3d0;
  uint32_t arg_id_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_1;
  bool patch_added_out;
  bool patch_added_in;
  bool control_point_added_out;
  _Rb_tree_const_iterator<unsigned_int> _Stack_3b0;
  bool control_point_added_in;
  undefined1 local_3a8;
  _Base_ptr local_3a0;
  undefined1 local_398;
  _Node_iterator_base<unsigned_int,_false> local_390;
  _Node_iterator_base<unsigned_int,_false> local_388;
  uint32_t local_37c;
  _Rb_tree_const_iterator<unsigned_int> _Stack_378;
  uint32_t base_id_6;
  undefined1 local_370;
  _Node_iterator_base<unsigned_int,_false> local_368;
  _Node_iterator_base<unsigned_int,_false> local_360;
  uint32_t local_354;
  _Rb_tree_const_iterator<unsigned_int> _Stack_350;
  uint32_t base_id_5;
  undefined1 local_348;
  _Base_ptr local_340;
  undefined1 local_338;
  _Base_ptr local_330;
  undefined1 local_328;
  _Base_ptr local_320;
  undefined1 local_318;
  uint32_t local_30c;
  _Rb_tree_const_iterator<unsigned_int> _Stack_308;
  GroupOperation operation;
  undefined1 local_300;
  _Base_ptr local_2f8;
  undefined1 local_2f0;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  _Node_iterator_base<unsigned_int,_false> local_2d8;
  _Node_iterator_base<unsigned_int,_false> local_2d0;
  uint32_t local_2c4;
  _Rb_tree_const_iterator<unsigned_int> _Stack_2c0;
  uint32_t base_id_4;
  undefined1 local_2b8;
  uint32_t local_2ac;
  uint32_t local_2a8;
  uint32_t local_2a4;
  GLSLstd450 op_450;
  uint32_t extension_set;
  undefined1 local_298;
  _Node_iterator_base<unsigned_int,_false> local_290;
  _Node_iterator_base<unsigned_int,_false> local_288;
  uint32_t local_27c;
  SPIRVariable *local_278;
  SPIRVariable *var;
  _Rb_tree_const_iterator<unsigned_int> _Stack_268;
  uint32_t base_id_3;
  undefined1 local_260;
  _Node_iterator_base<unsigned_int,_false> local_258;
  _Node_iterator_base<unsigned_int,_false> local_250;
  uint32_t local_244;
  _Rb_tree_const_iterator<unsigned_int> _Stack_240;
  uint32_t ptr;
  undefined1 local_238;
  _Base_ptr local_230;
  undefined1 local_228;
  _Node_iterator_base<unsigned_int,_false> local_220;
  _Node_iterator_base<unsigned_int,_false> local_218;
  _Base_ptr local_210;
  undefined1 local_208;
  _Node_iterator_base<unsigned_int,_false> local_200;
  _Node_iterator_base<unsigned_int,_false> local_1f8;
  uint32_t local_1ec;
  _Rb_tree_const_iterator<unsigned_int> _Stack_1e8;
  uint32_t base_id_2;
  undefined1 local_1e0;
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  _Node_iterator_base<unsigned_int,_false> local_1c8;
  _Node_iterator_base<unsigned_int,_false> local_1c0;
  uint32_t local_1b4;
  _Rb_tree_const_iterator<unsigned_int> _Stack_1b0;
  uint32_t rvalue_id;
  undefined1 local_1a8;
  _Node_iterator_base<unsigned_int,_false> local_1a0;
  _Node_iterator_base<unsigned_int,_false> local_198;
  uint32_t local_18c;
  iterator iStack_188;
  uint32_t base_id_1;
  _Rb_tree_const_iterator<unsigned_int> local_180;
  undefined1 local_168 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> inner_func_args;
  uint32_t inner_func_id;
  _Node_iterator_base<unsigned_int,_false> local_120;
  _Node_iterator_base<unsigned_int,_false> local_118;
  uint32_t local_110;
  uint local_10c;
  uint32_t arg_id;
  uint32_t arg_idx;
  undefined1 local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0;
  SPIRType *local_d8;
  SPIRType *type;
  undefined1 local_c8;
  _Node_iterator_base<unsigned_int,_false> local_c0;
  _Node_iterator_base<unsigned_int,_false> local_b8;
  uint32_t local_b0;
  uint local_ac;
  uint32_t base_id;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end2;
  Instruction *__begin2;
  SmallVector<spirv_cross::Instruction,_8UL> *__range2;
  SPIRBlock *b;
  TypedID<(spirv_cross::Types)6> *pTStack_70;
  TypedID<(spirv_cross::Types)6> block;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  SPIRFunction *func;
  _Node_iterator_base<unsigned_int,_false> local_40;
  _Node_iterator_base<unsigned_int,_false> local_38;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_30;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *processed_func_ids_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *global_var_ids_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids_local;
  CompilerMSL *pCStack_10;
  uint32_t func_id_local;
  CompilerMSL *this_local;
  
  local_30 = processed_func_ids;
  processed_func_ids_local = global_var_ids;
  global_var_ids_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)added_arg_ids;
  added_arg_ids_local._4_4_ = func_id;
  pCStack_10 = this;
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(processed_func_ids,(key_type *)((long)&added_arg_ids_local + 4));
  local_40._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(local_30);
  bVar3 = ::std::__detail::operator!=(&local_38,&local_40);
  if (bVar3) {
    pmVar10 = ::std::
              unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->function_global_vars,(key_type *)((long)&added_arg_ids_local + 4))
    ;
    ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               global_var_ids_local,pmVar10);
  }
  else {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(local_30,(value_type *)((long)&added_arg_ids_local + 4));
    this_00 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,added_arg_ids_local._4_4_);
    __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                       (&(this_00->blocks).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    pTStack_70 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                           (&(this_00->blocks).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    for (; puVar2 = global_var_ids_local, __end1 != pTStack_70; __end1 = __end1 + 1) {
      b._4_4_ = __end1->id;
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&b + 4));
      __range2 = (SmallVector<spirv_cross::Instruction,_8UL> *)
                 Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this,uVar5);
      __begin2 = (Instruction *)&((SPIRBlock *)__range2)->ops;
      __end2 = VectorView<spirv_cross::Instruction>::begin
                         ((VectorView<spirv_cross::Instruction> *)__begin2);
      i = VectorView<spirv_cross::Instruction>::end
                    ((VectorView<spirv_cross::Instruction> *)__begin2);
      for (; __end2 != i; __end2 = __end2 + 1) {
        ops = (uint32_t *)__end2;
        _base_id = Compiler::stream((Compiler *)this,__end2);
        local_ac = (uint)(ushort)*ops;
        if (local_ac == 0xc) {
          local_2a4 = _base_id[2];
          pSVar9 = Compiler::get<spirv_cross::SPIRExtension>((Compiler *)this,local_2a4);
          puVar2 = global_var_ids_local;
          if (*(int *)&(pSVar9->super_IVariant).field_0xc == 1) {
            local_2a8 = _base_id[3];
            if ((local_2a8 == 0x23) || (local_2a8 == 0x33)) {
              local_2c4 = _base_id[5];
              local_2d0._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::find(processed_func_ids_local,&local_2c4);
              local_2d8._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end(processed_func_ids_local);
              bVar3 = ::std::__detail::operator!=(&local_2d0,&local_2d8);
              if (bVar3) {
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&local_2c4);
                local_2e8 = (_Base_ptr)pVar17.first._M_node;
                local_2e0 = pVar17.second;
              }
            }
            else if (local_2a8 - 0x4c < 3) {
              local_2ac = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)puVar2,&local_2ac);
              _Stack_2c0 = pVar17.first._M_node;
              local_2b8 = pVar17.second;
            }
          }
        }
        else if (local_ac == 0x39) {
          for (local_10c = 3; local_10c < ops[2]; local_10c = local_10c + 1) {
            local_110 = _base_id[local_10c];
            local_118._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,&local_110);
            local_120._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_118,&local_120);
            if (bVar3) {
              ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
              insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     global_var_ids_local,&local_110);
            }
          }
          inner_func_args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = _base_id[2];
          ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168);
          extract_global_variables_from_function
                    (this,inner_func_args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168,processed_func_ids_local,local_30);
          puVar2 = global_var_ids_local;
          local_180._M_node =
               (_Base_ptr)
               ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168);
          iStack_188 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)local_168);
          ::std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
          insert<std::_Rb_tree_const_iterator<unsigned_int>>
                    ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                     puVar2,local_180,(_Rb_tree_const_iterator<unsigned_int>)iStack_188._M_node);
          ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168);
        }
        else if (local_ac == 0x3c) {
          var._4_4_ = _base_id[2];
          local_278 = Compiler::maybe_get_backing_variable((Compiler *)this,var._4_4_);
          if (local_278 != (SPIRVariable *)0x0) {
            local_27c = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(local_278->super_IVariant).self);
            sVar7 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::count(&this->atomic_image_vars_emulated,&local_27c);
            local_511 = 0;
            if (sVar7 != 0) {
              uVar5 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(local_278->super_IVariant).field_0xc);
              pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
              bVar3 = VectorView<unsigned_int>::empty
                                (&(pSVar8->array).super_VectorView<unsigned_int>);
              local_511 = bVar3 ^ 0xff;
            }
            if ((local_511 & 1) != 0) {
              this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_01,
                         "Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support."
                        );
              __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            local_288._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,(key_type *)((long)&var + 4));
            local_290._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_288,&local_290);
            if (bVar3) {
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,(value_type_conflict3 *)((long)&var + 4));
              _op_450 = pVar17.first._M_node;
              local_298 = pVar17.second;
            }
          }
        }
        else if (local_ac == 0x3d) {
LAB_004148b1:
          local_b0 = _base_id[2];
          local_b8._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::find(processed_func_ids_local,&local_b0);
          local_c0._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::end(processed_func_ids_local);
          bVar3 = ::std::__detail::operator!=(&local_b8,&local_c0);
          if (bVar3) {
            pVar17 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&local_b0);
            type = (SPIRType *)pVar17.first._M_node;
            local_c8 = pVar17.second;
          }
          local_d8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*_base_id);
          if (((local_d8->basetype == Image) && ((local_d8->image).dim == DimSubpassData)) &&
             (((this->msl_options).use_framebuffer_fetch_subpasses & 1U) == 0)) {
            if (this->builtin_frag_coord_id == 0) {
              __assert_fail("builtin_frag_coord_id != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                            ,0x750,
                            "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                           );
            }
            pVar17 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&this->builtin_frag_coord_id);
            local_e8 = (_Base_ptr)pVar17.first._M_node;
            local_e0 = pVar17.second;
            if (((this->msl_options).multiview & 1U) == 0) {
              if (((this->msl_options).arrayed_subpass_input & 1U) != 0) {
                if (this->builtin_layer_id == 0) {
                  __assert_fail("builtin_layer_id != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                ,0x75b,
                                "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                               );
                }
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&this->builtin_layer_id);
                _arg_id = pVar17.first._M_node;
                local_100 = pVar17.second;
              }
            }
            else {
              if (this->builtin_view_idx_id == 0) {
                __assert_fail("builtin_view_idx_id != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                              ,0x755,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&this->builtin_view_idx_id);
              local_f8 = (_Base_ptr)pVar17.first._M_node;
              local_f0 = pVar17.second;
            }
          }
        }
        else if (local_ac == 0x3e) {
          local_18c = *_base_id;
          local_198._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::find(processed_func_ids_local,&local_18c);
          local_1a0._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::end(processed_func_ids_local);
          bVar3 = ::std::__detail::operator!=(&local_198,&local_1a0);
          if (bVar3) {
            pVar17 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&local_18c);
            _Stack_1b0 = pVar17.first._M_node;
            local_1a8 = pVar17.second;
            if ((((this->msl_options).input_attachment_is_ds_attachment & 1U) != 0) &&
               (local_18c == this->builtin_frag_depth_id)) {
              this->writes_to_depth = true;
            }
          }
          local_1b4 = _base_id[1];
          local_1c0._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::find(processed_func_ids_local,&local_1b4);
          local_1c8._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::end(processed_func_ids_local);
          bVar3 = ::std::__detail::operator!=(&local_1c0,&local_1c8);
          if (bVar3) {
            pVar17 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&local_1b4);
            local_1d8 = (_Base_ptr)pVar17.first._M_node;
            local_1d0 = pVar17.second;
          }
          bVar3 = needs_frag_discard_checks(this);
          if (bVar3) {
            pVar17 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&this->builtin_helper_invocation_id);
            _Stack_1e8 = pVar17.first._M_node;
            local_1e0 = pVar17.second;
          }
        }
        else {
          if (local_ac - 0x41 < 4) goto LAB_004148b1;
          if (local_ac == 99) {
LAB_00414e42:
            bVar3 = needs_frag_discard_checks(this);
            if (bVar3) {
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&this->builtin_helper_invocation_id);
              _Stack_240 = pVar17.first._M_node;
              local_238 = pVar17.second;
            }
            if ((local_ac == 0xe4) || (local_ac == 99)) {
              local_244 = *_base_id;
            }
            else {
              local_244 = _base_id[2];
            }
            local_250._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,&local_244);
            local_258._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_250,&local_258);
            if (bVar3) {
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&local_244);
              _Stack_268 = pVar17.first._M_node;
              local_260 = pVar17.second;
            }
          }
          else if (local_ac == 0xa9) {
            local_1ec = _base_id[3];
            local_1f8._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,&local_1ec);
            local_200._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_1f8,&local_200);
            if (bVar3) {
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&local_1ec);
              local_210 = (_Base_ptr)pVar17.first._M_node;
              local_208 = pVar17.second;
            }
            local_1ec = _base_id[4];
            local_218._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,&local_1ec);
            local_220._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_218,&local_220);
            if (bVar3) {
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&local_1ec);
              local_230 = (_Base_ptr)pVar17.first._M_node;
              local_228 = pVar17.second;
            }
          }
          else {
            if ((local_ac - 0xe4 < 3) || (local_ac - 0xe8 < 0xb)) goto LAB_00414e42;
            if (local_ac == 0x154) {
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&this->builtin_subgroup_invocation_id_id);
              local_2f8 = (_Base_ptr)pVar17.first._M_node;
              local_2f0 = pVar17.second;
            }
            else if (local_ac == 0x156) {
              local_30c = _base_id[3];
              if (local_30c == 0) {
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&this->builtin_subgroup_size_id);
                local_320 = (_Base_ptr)pVar17.first._M_node;
                local_318 = pVar17.second;
              }
              else if (local_30c - 1 < 2) {
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&this->builtin_subgroup_invocation_id_id);
                local_330 = (_Base_ptr)pVar17.first._M_node;
                local_328 = pVar17.second;
              }
            }
            else if (local_ac - 0x157 < 2) {
              pVar17 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&this->builtin_subgroup_size_id);
              _Stack_308 = pVar17.first._M_node;
              local_300 = pVar17.second;
            }
            else if (local_ac - 0x1179 < 5) {
              local_354 = *_base_id;
              local_360._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::find(processed_func_ids_local,&local_354);
              local_368._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end(processed_func_ids_local);
              bVar3 = ::std::__detail::operator!=(&local_360,&local_368);
              if (bVar3) {
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&local_354);
                _Stack_378 = pVar17.first._M_node;
                local_370 = pVar17.second;
              }
            }
            else if (local_ac == 0x117f) {
LAB_0041539b:
              local_37c = _base_id[2];
              local_388._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::find(processed_func_ids_local,&local_37c);
              local_390._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end(processed_func_ids_local);
              bVar3 = ::std::__detail::operator!=(&local_388,&local_390);
              if (bVar3) {
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&local_37c);
                local_3a0 = (_Base_ptr)pVar17.first._M_node;
                local_398 = pVar17.second;
              }
            }
            else if (local_ac == 0x1504) {
              bVar3 = needs_manual_helper_invocation_updates(this);
              if ((bVar3) && ((this->needs_helper_invocation & 1U) != 0)) {
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&this->builtin_helper_invocation_id);
                local_340 = (_Base_ptr)pVar17.first._M_node;
                local_338 = pVar17.second;
              }
            }
            else if (local_ac == 0x1505) {
              bVar3 = needs_manual_helper_invocation_updates(this);
              if (bVar3) {
                pVar17 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&this->builtin_helper_invocation_id);
                _Stack_350 = pVar17.first._M_node;
                local_348 = pVar17.second;
              }
            }
            else {
              if (local_ac - 0x1780 < 0x11) goto LAB_0041539b;
              if (local_ac == 0x1793) goto LAB_00414e42;
            }
          }
        }
        bVar3 = needs_manual_helper_invocation_updates(this);
        if (((bVar3) &&
            (*(int *)((long)&(__range2->super_VectorView<spirv_cross::Instruction>).buffer_size + 4)
             == 6)) && ((this->needs_helper_invocation & 1U) != 0)) {
          pVar17 = ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&this->builtin_helper_invocation_id);
          _Stack_3b0 = pVar17.first._M_node;
          local_3a8 = pVar17.second;
        }
      }
    }
    pmVar10 = ::std::
              unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->function_global_vars,(key_type *)((long)&added_arg_ids_local + 4))
    ;
    ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              (pmVar10,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       puVar2);
    uVar5 = added_arg_ids_local._4_4_;
    uVar6 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point)
    ;
    puVar2 = global_var_ids_local;
    if (uVar5 != uVar6) {
      __range2_1._7_1_ = 0;
      __range2_1._6_1_ = 0;
      __range2_1._5_1_ = 0;
      __range2_1._4_1_ = 0;
      __end2_1 = ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       global_var_ids_local);
      iStack_3d0 = ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)puVar2);
      while (bVar3 = ::std::operator!=(&__end2_1,&stack0xfffffffffffffc30), bVar3) {
        puVar11 = ::std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2_1);
        var_1._4_4_ = *puVar11;
        pSStack_3e0 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_1._4_4_);
        p_type._4_4_ = TypedID::operator_cast_to_unsigned_int
                                 ((TypedID *)&(pSStack_3e0->super_IVariant).field_0xc);
        pSStack_3f0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,p_type._4_4_);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_3f8,var_1._4_4_);
        uStack_3f4 = Compiler::get_decoration((Compiler *)this,local_3f8,BuiltIn);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_400,var_1._4_4_);
        bVar3 = Compiler::has_decoration((Compiler *)this,local_400,DecorationPatch);
        local_549 = true;
        if (!bVar3) {
          local_549 = is_patch_block(this,pSStack_3f0);
        }
        is_block = local_549;
        bVar3 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSStack_3f0->super_IVariant).self.id,Block);
        local_54a = false;
        if ((is_block & 1U) == 0) {
          bVar4 = Compiler::is_tessellation_shader((Compiler *)this);
          if ((!bVar4) || (local_54b = true, pSStack_3e0->storage != Input)) {
            bVar4 = is_tesc_shader(this);
            local_54c = false;
            if (bVar4) {
              local_54c = pSStack_3e0->storage == Output;
            }
            local_54b = local_54c;
          }
          local_54a = local_54b;
        }
        name.field_2._M_local_buf[0xf] = local_54a;
        local_54d = false;
        if (((is_block & 1U) != 0) && (local_54d = false, bVar3)) {
          local_54d = pSStack_3e0->storage == Output;
        }
        name.field_2._M_local_buf[0xe] = local_54d;
        name.field_2._M_local_buf[0xd] = Compiler::is_builtin_variable((Compiler *)this,pSStack_3e0)
        ;
        local_54e = true;
        if (((((bool)name.field_2._M_local_buf[0xd]) && (local_54e = true, uStack_3f4 != 0)) &&
            (local_54e = true, uStack_3f4 != 1)) &&
           ((local_54e = true, uStack_3f4 != 3 && (local_54e = true, uStack_3f4 != 4)))) {
          local_54e = pSStack_3f0->basetype == Struct;
        }
        name.field_2._M_local_buf[0xc] = local_54e;
        if (((name.field_2._M_local_buf[0xf] & 1U) != 0) ||
           (local_54f = false, (name.field_2._M_local_buf[0xe] & 1U) != 0)) {
          local_54f = local_54e;
        }
        name.field_2._M_local_buf[0xb] = local_54f;
        if ((local_54f != false) && (pSStack_3e0->storage == Output)) {
          bVar3 = CompilerGLSL::is_stage_output_variable_masked
                            (&this->super_CompilerGLSL,pSStack_3e0);
          name.field_2._M_local_buf[0xb] = (bVar3 ^ 0xffU) & 1;
        }
        if (name.field_2._M_local_buf[0xb] == '\0') {
          if ((name.field_2._M_local_buf[0xd] & 1U) == 0) {
LAB_004160b2:
            local_4d0 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1)
            ;
            TypedID<(spirv_cross::Types)1>::TypedID(&local_4d4,p_type._4_4_);
            TypedID<(spirv_cross::Types)0>::TypedID(&local_4d8,local_4d0);
            SPIRFunction::add_parameter(this_00,local_4d4,local_4d8,true);
            local_4e0[1] = 7;
            local_4e0[0] = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,local_4d0,(uint *)((long)&p_type + 4),
                       (StorageClass *)(local_4e0 + 1),local_4e0,(uint *)((long)&var_1 + 4));
            TypedID<(spirv_cross::Types)0>::TypedID(&local_4e4,var_1._4_4_);
            pmVar15 = ::std::
                      unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                      ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_4e4);
            TypedID<(spirv_cross::Types)0>::TypedID(&local_4e8,local_4d0);
            this_02 = ::std::
                      unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                      ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_4e8);
            Meta::operator=(this_02,pmVar15);
          }
          else {
            local_478 = (pSStack_3f0->super_IVariant).self.id;
            bVar3 = Compiler::has_decoration((Compiler *)this,(ID)local_478,Block);
            if (!bVar3) goto LAB_004160b2;
            p_type._4_4_ = Compiler::get_pointee_type_id((Compiler *)this,p_type._4_4_);
            pSStack_3f0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,p_type._4_4_);
            __range5._4_4_ = 0;
            __begin5 = (TypedID<(spirv_cross::Types)1> *)&pSStack_3f0->member_types;
            __end5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                               ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin5
                               );
            mbr_type_id = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                     __begin5);
            for (; __end5 != mbr_type_id; __end5 = __end5 + 1) {
              _next_ids = (TypedID *)__end5;
              ptr_type_id = 0x7fffffff;
              name.field_2._M_local_buf[0xd] =
                   Compiler::is_member_builtin
                             ((Compiler *)this,pSStack_3f0,__range5._4_4_,&ptr_type_id);
              if (((bool)name.field_2._M_local_buf[0xd]) &&
                 (bVar3 = Compiler::has_active_builtin
                                    ((Compiler *)this,ptr_type_id,pSStack_3e0->storage), bVar3)) {
                uVar5 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2)
                ;
                ptr_1._0_4_ = uVar5 + 1;
                ptr_1._4_4_ = uVar5;
                var_id = uVar5;
                uVar6 = TypedID::operator_cast_to_unsigned_int(_next_ids);
                pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
                local_4b8 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                      ((Compiler *)this,uVar5,pSVar8);
                TypedID<(spirv_cross::Types)0>::operator=
                          (&(local_4b8->super_IVariant).self,
                           (TypedID<(spirv_cross::Types)1> *)_next_ids);
                local_4b8->storage = pSStack_3e0->storage;
                local_4b8->pointer = true;
                local_4b8->pointer_depth = local_4b8->pointer_depth + 1;
                (local_4b8->parent_type).id = *(uint32_t *)_next_ids;
                local_4bc.id = *(uint32_t *)_next_ids;
                TypedID<(spirv_cross::Types)0>::TypedID(&local_4c0,(uint32_t)ptr_1);
                SPIRFunction::add_parameter(this_00,local_4bc,local_4c0,true);
                local_4c4 = Function;
                Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                          ((Compiler *)this,(uint32_t)ptr_1,(uint *)((long)&ptr_1 + 4),&local_4c4);
                TypedID<(spirv_cross::Types)0>::TypedID
                          ((TypedID<(spirv_cross::Types)0> *)&next_id_1,p_type._4_4_);
                pmVar15 = ::std::
                          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                          ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                       (key_type *)&next_id_1);
                pDVar14 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                                    (&(pmVar15->members).
                                      super_VectorView<spirv_cross::Meta::Decoration>,
                                     (ulong)__range5._4_4_);
                TypedID<(spirv_cross::Types)0>::TypedID(&local_4cc,(uint32_t)ptr_1);
                pmVar15 = ::std::
                          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                          ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_4cc
                                      );
                Meta::Decoration::operator=(&pmVar15->decoration,pDVar14);
              }
              __range5._4_4_ = __range5._4_4_ + 1;
            }
          }
        }
        else {
          ::std::__cxx11::string::string((string *)&mbr_idx);
          if ((is_block & 1U) == 0) {
            pcVar16 = "gl_out";
            if (pSStack_3e0->storage == Input) {
              pcVar16 = "gl_in";
            }
            ::std::__cxx11::string::operator=((string *)&mbr_idx,pcVar16);
          }
          else {
            if (pSStack_3e0->storage == Input) {
              local_558 = (string *)&this->patch_stage_in_var_name;
            }
            else {
              local_558 = (string *)&this->patch_stage_out_var_name;
            }
            ::std::__cxx11::string::operator=((string *)&mbr_idx,local_558);
          }
          if (pSStack_3e0->storage == Output) {
            local_434 = (pSStack_3f0->super_IVariant).self.id;
            bVar3 = Compiler::has_decoration((Compiler *)this,(ID)local_434,Block);
            if (bVar3) {
              for (local_438 = 0; uVar1 = local_438,
                  sVar12 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                     (&(pSStack_3f0->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                     ), uVar1 < (uint)sVar12; local_438 = local_438 + 1) {
                bVar3 = CompilerGLSL::is_stage_output_block_member_masked
                                  (&this->super_CompilerGLSL,pSStack_3e0,local_438,true);
                if (bVar3) {
                  added_in._4_4_ = *(uint32_t *)&(pSStack_3e0->super_IVariant).field_0xc;
                  added_in._0_4_ = (pSStack_3e0->super_IVariant).self.id;
                  SPIRFunction::add_parameter(this_00,added_in._4_4_,added_in._0_4_,true);
                  break;
                }
              }
            }
          }
          if (pSStack_3e0->storage == Input) {
            if ((is_block & 1U) == 0) {
              local_570 = (byte *)((long)&__range2_1 + 7);
            }
            else {
              local_570 = (byte *)((long)&__range2_1 + 5);
            }
            local_448 = local_570;
            if ((*local_570 & 1) == 0) {
              if ((is_block & 1U) == 0) {
                local_578 = (TypedID *)&this->stage_in_ptr_var_id;
              }
              else {
                local_578 = (TypedID *)&this->patch_stage_in_var_id;
              }
              var_1._4_4_ = TypedID::operator_cast_to_unsigned_int(local_578);
              *local_448 = 1;
              goto LAB_00415b91;
            }
            added_out._4_4_ = 0xd;
          }
          else {
            if (pSStack_3e0->storage == Output) {
              if ((is_block & 1U) == 0) {
                local_588 = (byte *)((long)&__range2_1 + 6);
              }
              else {
                local_588 = (byte *)((long)&__range2_1 + 4);
              }
              pbStack_458 = local_588;
              if ((*local_588 & 1) != 0) {
                added_out._4_4_ = 0xd;
                goto LAB_00415d36;
              }
              if ((is_block & 1U) == 0) {
                local_590 = (TypedID *)&this->stage_out_ptr_var_id;
              }
              else {
                local_590 = (TypedID *)&this->patch_stage_out_var_id;
              }
              var_1._4_4_ = TypedID::operator_cast_to_unsigned_int(local_590);
              *pbStack_458 = 1;
            }
LAB_00415b91:
            pSVar13 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_1._4_4_);
            p_type._4_4_ = TypedID::operator_cast_to_unsigned_int
                                     ((TypedID *)&(pSVar13->super_IVariant).field_0xc);
            local_45c = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1)
            ;
            TypedID<(spirv_cross::Types)1>::TypedID(&local_460,p_type._4_4_);
            TypedID<(spirv_cross::Types)0>::TypedID(&local_464,local_45c);
            SPIRFunction::add_parameter(this_00,local_460,local_464,true);
            local_46c[1] = 7;
            local_46c[0] = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,local_45c,(uint *)((long)&p_type + 4),
                       (StorageClass *)(local_46c + 1),local_46c,(uint *)((long)&var_1 + 4));
            TypedID<(spirv_cross::Types)0>::TypedID(&local_470,local_45c);
            Compiler::set_name((Compiler *)this,local_470,(string *)&mbr_idx);
            bVar3 = is_tese_shader(this);
            if (((bVar3) && (((this->msl_options).raw_buffer_tese_input & 1U) != 0)) &&
               (pSStack_3e0->storage == Input)) {
              TypedID<(spirv_cross::Types)0>::TypedID
                        ((TypedID<(spirv_cross::Types)0> *)&mbr_idx_1,local_45c);
              Compiler::set_decoration((Compiler *)this,(ID)mbr_idx_1,DecorationNonWritable,0);
            }
            added_out._4_4_ = 0;
          }
LAB_00415d36:
          ::std::__cxx11::string::~string((string *)&mbr_idx);
        }
        ::std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2_1);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
				{
					added_arg_ids.insert(base_id);

					if (msl_options.input_attachment_is_ds_attachment && base_id == builtin_frag_depth_id)
						writes_to_depth = true;
				}

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpAtomicExchange:
			case OpAtomicCompareExchange:
			case OpAtomicStore:
			case OpAtomicIIncrement:
			case OpAtomicIDecrement:
			case OpAtomicIAdd:
			case OpAtomicFAddEXT:
			case OpAtomicISub:
			case OpAtomicSMin:
			case OpAtomicUMin:
			case OpAtomicSMax:
			case OpAtomicUMax:
			case OpAtomicAnd:
			case OpAtomicOr:
			case OpAtomicXor:
			case OpImageWrite:
			{
				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);
				uint32_t ptr = 0;
				if (op == OpAtomicStore || op == OpImageWrite)
					ptr = ops[0];
				else
					ptr = ops[2];
				if (global_var_ids.find(ptr) != global_var_ids.end())
					added_arg_ids.insert(ptr);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var)
				{
					if (atomic_image_vars_emulated.count(var->self) &&
					    !get<SPIRType>(var->basetype).array.empty())
					{
						SPIRV_CROSS_THROW(
								"Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support.");
					}

					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			case OpExtInst:
			{
				uint32_t extension_set = ops[2];
				if (get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
				{
					auto op_450 = static_cast<GLSLstd450>(ops[3]);
					switch (op_450)
					{
					case GLSLstd450InterpolateAtCentroid:
					case GLSLstd450InterpolateAtSample:
					case GLSLstd450InterpolateAtOffset:
					{
						// For these, we really need the stage-in block. It is theoretically possible to pass the
						// interpolant object, but a) doing so would require us to create an entirely new variable
						// with Interpolant type, and b) if we have a struct or array, handling all the members and
						// elements could get unwieldy fast.
						added_arg_ids.insert(stage_in_var_id);
						break;
					}

					case GLSLstd450Modf:
					case GLSLstd450Frexp:
					{
						uint32_t base_id = ops[5];
						if (global_var_ids.find(base_id) != global_var_ids.end())
							added_arg_ids.insert(base_id);
						break;
					}

					default:
						break;
					}
				}
				break;
			}

			case OpGroupNonUniformInverseBallot:
			{
				added_arg_ids.insert(builtin_subgroup_invocation_id_id);
				break;
			}

			case OpGroupNonUniformBallotFindLSB:
			case OpGroupNonUniformBallotFindMSB:
			{
				added_arg_ids.insert(builtin_subgroup_size_id);
				break;
			}

			case OpGroupNonUniformBallotBitCount:
			{
				auto operation = static_cast<GroupOperation>(ops[3]);
				switch (operation)
				{
				case GroupOperationReduce:
					added_arg_ids.insert(builtin_subgroup_size_id);
					break;
				case GroupOperationInclusiveScan:
				case GroupOperationExclusiveScan:
					added_arg_ids.insert(builtin_subgroup_invocation_id_id);
					break;
				default:
					break;
				}
				break;
			}

			case OpDemoteToHelperInvocation:
				if (needs_manual_helper_invocation_updates() && needs_helper_invocation)
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpIsHelperInvocationEXT:
				if (needs_manual_helper_invocation_updates())
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpRayQueryInitializeKHR:
			case OpRayQueryProceedKHR:
			case OpRayQueryTerminateKHR:
			case OpRayQueryGenerateIntersectionKHR:
			case OpRayQueryConfirmIntersectionKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpRayQueryGetRayTMinKHR:
			case OpRayQueryGetRayFlagsKHR:
			case OpRayQueryGetWorldRayOriginKHR:
			case OpRayQueryGetWorldRayDirectionKHR:
			case OpRayQueryGetIntersectionCandidateAABBOpaqueKHR:
			case OpRayQueryGetIntersectionTypeKHR:
			case OpRayQueryGetIntersectionTKHR:
			case OpRayQueryGetIntersectionInstanceCustomIndexKHR:
			case OpRayQueryGetIntersectionInstanceIdKHR:
			case OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR:
			case OpRayQueryGetIntersectionGeometryIndexKHR:
			case OpRayQueryGetIntersectionPrimitiveIndexKHR:
			case OpRayQueryGetIntersectionBarycentricsKHR:
			case OpRayQueryGetIntersectionFrontFaceKHR:
			case OpRayQueryGetIntersectionObjectRayDirectionKHR:
			case OpRayQueryGetIntersectionObjectRayOriginKHR:
			case OpRayQueryGetIntersectionObjectToWorldKHR:
			case OpRayQueryGetIntersectionWorldToObjectKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			default:
				break;
			}

			if (needs_manual_helper_invocation_updates() && b.terminator == SPIRBlock::Kill &&
			    needs_helper_invocation)
				added_arg_ids.insert(builtin_helper_invocation_id);

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool control_point_added_in = false;
		bool control_point_added_out = false;
		bool patch_added_in = false;
		bool patch_added_out = false;

		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			bool is_patch = has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type);
			bool is_block = has_decoration(p_type->self, DecorationBlock);
			bool is_control_point_storage =
			    !is_patch && ((is_tessellation_shader() && var.storage == StorageClassInput) ||
			                  (is_tesc_shader() && var.storage == StorageClassOutput));
			bool is_patch_block_storage = is_patch && is_block && var.storage == StorageClassOutput;
			bool is_builtin = is_builtin_variable(var);
			bool variable_is_stage_io =
					!is_builtin || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
					bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
					p_type->basetype == SPIRType::Struct;
			bool is_redirected_to_global_stage_io = (is_control_point_storage || is_patch_block_storage) &&
			                                        variable_is_stage_io;

			// If output is masked it is not considered part of the global stage IO interface.
			if (is_redirected_to_global_stage_io && var.storage == StorageClassOutput)
				is_redirected_to_global_stage_io = !is_stage_output_variable_masked(var);

			if (is_redirected_to_global_stage_io)
			{
				// Tessellation control shaders see inputs and per-point outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-point inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (is_patch)
					name = var.storage == StorageClassInput ? patch_stage_in_var_name : patch_stage_out_var_name;
				else
					name = var.storage == StorageClassInput ? "gl_in" : "gl_out";

				if (var.storage == StorageClassOutput && has_decoration(p_type->self, DecorationBlock))
				{
					// If we're redirecting a block, we might still need to access the original block
					// variable if we're masking some members.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(p_type->member_types.size()); mbr_idx++)
					{
						if (is_stage_output_block_member_masked(var, mbr_idx, true))
						{
							func.add_parameter(var.basetype, var.self, true);
							break;
						}
					}
				}

				if (var.storage == StorageClassInput)
				{
					auto &added_in = is_patch ? patch_added_in : control_point_added_in;
					if (added_in)
						continue;
					arg_id = is_patch ? patch_stage_in_var_id : stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					auto &added_out = is_patch ? patch_added_out : control_point_added_out;
					if (added_out)
						continue;
					arg_id = is_patch ? patch_stage_out_var_id : stage_out_ptr_var_id;
					added_out = true;
				}

				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
				if (is_tese_shader() && msl_options.raw_buffer_tese_input && var.storage == StorageClassInput)
					set_decoration(next_id, DecorationNonWritable);
			}
			else if (is_builtin && has_decoration(p_type->self, DecorationBlock))
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.pointer_depth++;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the new variable has all the same meta info
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}